

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

int item_number(Fl_Menu_Item *m,char *i)

{
  int iVar1;
  char *__s1;
  Fl_Menu_Item *pFVar2;
  
  if (i != (char *)0x0 && m != (Fl_Menu_Item *)0x0) {
    if ((*i == 'F') && (i[1] == 'L')) {
      i = i + (ulong)(i[2] == '_') * 3;
    }
    __s1 = m->text;
    if (__s1 != (char *)0x0) {
      pFVar2 = m + 1;
      do {
        iVar1 = strcmp(__s1,i);
        if (iVar1 == 0) {
          return *(int *)&pFVar2[-1].user_data_;
        }
        __s1 = pFVar2->text;
        pFVar2 = pFVar2 + 1;
      } while (__s1 != (char *)0x0);
    }
  }
  iVar1 = atoi(i);
  return iVar1;
}

Assistant:

int item_number(Fl_Menu_Item* m, const char* i) {
  if (m && i) {
    if (i[0]=='F' && i[1]=='L' && i[2]=='_') i += 3;
    while (m->label()) {
      if (!strcmp(m->label(), i)) return int(m->argument());
      m++;
    }
  }
  return atoi(i);
}